

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O0

size_type __thiscall serialization::json_iarchive::load_sequence_start(json_iarchive *this)

{
  bool bVar1;
  SizeType SVar2;
  reference ppGVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_18;
  json_iarchive *this_local;
  
  local_18.data_.o.members = (Member *)this;
  bVar1 = std::
          stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    ppGVar3 = std::
              stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
              ::top(&this->stack_);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(*ppGVar3);
    if (bVar1) goto LAB_0013f17d;
  }
  throw_serialization_error("expect array","json");
LAB_0013f17d:
  std::
  stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
  ::top(&this->stack_);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetArray(&local_18);
  SVar2 = rapidjson::
          GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::Size((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                  *)&local_18);
  rapidjson::
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericArray((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                   *)&local_18);
  return SVar2;
}

Assistant:

size_type load_sequence_start() const
    {
        if(stack_.empty() || (!stack_.top()->IsArray()))
            throw_serialization_error("expect array", "json");
        return stack_.top()->GetArray().Size();
    }